

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuilderTask.cpp
# Opt level: O2

void __thiscall
nigel::BuilderExecutable::generateNotification
          (BuilderExecutable *this,NT error,shared_ptr<nigel::Token> *token)

{
  undefined1 local_24 [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_24._0_4_ = error;
  std::
  make_shared<nigel::CompileNotification,nigel::CompileNotification::Type&,std::shared_ptr<nigel::Token>&>
            ((Type *)(local_24 + 4),(shared_ptr<nigel::Token> *)local_24);
  std::__cxx11::
  list<std::shared_ptr<nigel::CompileNotification>,_std::allocator<std::shared_ptr<nigel::CompileNotification>_>_>
  ::push_back(&this->notificationList,(value_type *)(local_24 + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

void BuilderExecutable::generateNotification( NT error, std::shared_ptr<Token> token )
	{
		notificationList.push_back( std::make_shared<CompileNotification>( error, token ) );
	}